

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O0

void __thiscall piece_data::add_piece(piece_data *this,Color *c,Piece *p,Square *s,info *ifo)

{
  value_type vVar1;
  value_type vVar2;
  value_type_conflict1 vVar3;
  value_type vVar4;
  ulong uVar5;
  reference pvVar6;
  reference this_00;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference this_01;
  reference this_02;
  reference pvVar10;
  reference pvVar11;
  reference this_03;
  reference this_04;
  reference pvVar12;
  reference pvVar13;
  U64 UVar14;
  U64 sq;
  info *ifo_local;
  Square *s_local;
  Piece *p_local;
  Color *c_local;
  piece_data *this_local;
  
  uVar5 = (&bitboards::squares)[*s];
  pvVar6 = std::array<unsigned_long,_2UL>::operator[](&this->bycolor,(ulong)*c);
  *pvVar6 = uVar5 | *pvVar6;
  this_00 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[](&this->bitmap,(ulong)*c);
  pvVar7 = std::array<unsigned_long,_64UL>::operator[](this_00,(ulong)*p);
  *pvVar7 = uVar5 | *pvVar7;
  pvVar8 = std::array<std::array<int,_6UL>,_2UL>::operator[](&this->number_of,(ulong)*c);
  pvVar9 = std::array<int,_6UL>::operator[](pvVar8,(ulong)*p);
  *pvVar9 = *pvVar9 + 1;
  vVar1 = *s;
  this_01 = std::array<std::array<std::array<Square,_11UL>,_6UL>,_2UL>::operator[]
                      (&this->square_of,(ulong)*c);
  this_02 = std::array<std::array<Square,_11UL>,_6UL>::operator[](this_01,(ulong)*p);
  pvVar8 = std::array<std::array<int,_6UL>,_2UL>::operator[](&this->number_of,(ulong)*c);
  pvVar9 = std::array<int,_6UL>::operator[](pvVar8,(ulong)*p);
  pvVar10 = std::array<Square,_11UL>::operator[](this_02,(long)*pvVar9);
  *pvVar10 = vVar1;
  vVar2 = *p;
  pvVar11 = std::array<Piece,_64UL>::operator[](&this->piece_on,(ulong)*s);
  *pvVar11 = vVar2;
  pvVar8 = std::array<std::array<int,_6UL>,_2UL>::operator[](&this->number_of,(ulong)*c);
  pvVar9 = std::array<int,_6UL>::operator[](pvVar8,(ulong)*p);
  vVar3 = *pvVar9;
  this_03 = std::array<std::array<std::array<int,_64UL>,_6UL>,_2UL>::operator[]
                      (&this->piece_idx,(ulong)*c);
  this_04 = std::array<std::array<int,_64UL>,_6UL>::operator[](this_03,(ulong)*p);
  pvVar12 = std::array<int,_64UL>::operator[](this_04,(ulong)*s);
  *pvVar12 = vVar3;
  vVar4 = *c;
  pvVar13 = std::array<Color,_64UL>::operator[](&this->color_on,(ulong)*s);
  *pvVar13 = vVar4;
  UVar14 = zobrist::piece(s,c,p);
  ifo->key = UVar14 ^ ifo->key;
  UVar14 = zobrist::piece(s,c,p);
  ifo->mkey = UVar14 ^ ifo->mkey;
  UVar14 = zobrist::piece(s,c,p);
  ifo->repkey = UVar14 ^ ifo->repkey;
  if (*p == pawn) {
    UVar14 = zobrist::piece(s,c,p);
    ifo->pawnkey = UVar14 ^ ifo->pawnkey;
  }
  return;
}

Assistant:

inline void piece_data::add_piece(const Color& c, const Piece& p, const Square& s, info& ifo) {
	U64 sq = bitboards::squares[s];
	bycolor[c] |= sq;
	bitmap[c][p] |= sq;

	number_of[c][p] += 1;
	square_of[c][p][number_of[c][p]] = s;
	piece_on[s] = p;
	piece_idx[c][p][s] = number_of[c][p];
	color_on[s] = c;
	ifo.key ^= zobrist::piece(s, c, p);
	ifo.mkey ^= zobrist::piece(s, c, p);
	ifo.repkey ^= zobrist::piece(s, c, p);
	if (p == Piece::pawn) ifo.pawnkey ^= zobrist::piece(s, c, p);
}